

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Input.cxx
# Opt level: O3

void __thiscall Fl_File_Input::draw_buttons(Fl_File_Input *this)

{
  int iVar1;
  int iVar2;
  short sVar3;
  int Y;
  int X;
  Fl_Boxtype t;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  if (((this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.damage_ & 0x90) != 0) {
    update_buttons(this);
  }
  sVar3 = this->buttons_[0];
  uVar8 = 0;
  if (sVar3 == 0) {
    iVar7 = 0;
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    iVar7 = 0;
    do {
      iVar6 = (int)sVar3;
      iVar1 = (this->super_Fl_Input).super_Fl_Input_.xscroll_;
      iVar5 = (iVar7 + iVar6) - iVar1;
      if (iVar5 != 0 && iVar1 <= iVar7 + iVar6) {
        if (iVar7 < iVar1) {
          t = (Fl_Boxtype)
              ((1 < this->down_box_ && uVar8 == (uint)(int)this->pressed_) | this->down_box_);
          X = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
          Y = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
          iVar6 = iVar5;
        }
        else {
          Y = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
          iVar2 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_;
          X = (iVar7 - iVar1) + (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
          t = (Fl_Boxtype)
              ((1 < this->down_box_ && uVar8 == (uint)(int)this->pressed_) | this->down_box_);
          if (iVar2 < iVar5) {
            iVar6 = iVar1 + iVar4 + iVar2;
          }
        }
        Fl_Widget::draw_box((Fl_Widget *)this,t,X,Y,iVar6,10,0x31);
      }
      iVar7 = iVar7 + this->buttons_[uVar8];
      iVar4 = -iVar7;
      sVar3 = this->buttons_[uVar8 + 1];
      uVar8 = uVar8 + 1;
    } while (sVar3 != 0);
  }
  iVar1 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_;
  if (iVar7 < iVar1) {
    iVar6 = (this->super_Fl_Input).super_Fl_Input_.xscroll_;
    Fl_Widget::draw_box((Fl_Widget *)this,
                        (uint)((1 < this->down_box_ && (int)uVar8 == (int)this->pressed_) |
                              this->down_box_),
                        (iVar7 + (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_) - iVar6,
                        (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_,
                        iVar1 + iVar4 + iVar6,10,0x31);
  }
  return;
}

Assistant:

void Fl_File_Input::draw_buttons() {
  int	i,					// Looping var
	X;					// Current X position


  if (damage() & (FL_DAMAGE_BAR | FL_DAMAGE_ALL)) {
    update_buttons();
  }

  for (X = 0, i = 0; buttons_[i]; i ++)
  {
    if ((X + buttons_[i]) > xscroll()) {
      if (X < xscroll()) {
        draw_box(pressed_ == i ? fl_down(down_box()) : down_box(),
                 x(), y(), X + buttons_[i] - xscroll(), DIR_HEIGHT, FL_GRAY);
      } else if ((X + buttons_[i] - xscroll()) > w()) {
	draw_box(pressed_ == i ? fl_down(down_box()) : down_box(),
        	 x() + X - xscroll(), y(), w() - X + xscroll(), DIR_HEIGHT,
		 FL_GRAY);
      } else {
        draw_box(pressed_ == i ? fl_down(down_box()) : down_box(),
	         x() + X - xscroll(), y(), buttons_[i], DIR_HEIGHT, FL_GRAY);
      }
    }

    X += buttons_[i];
  }

  if (X < w()) {
    draw_box(pressed_ == i ? fl_down(down_box()) : down_box(),
             x() + X - xscroll(), y(), w() - X + xscroll(), DIR_HEIGHT, FL_GRAY);
  }
}